

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O3

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<4,_13,_13>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int i;
  undefined8 *puVar1;
  long lVar2;
  undefined4 *puVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  long lVar6;
  long lVar7;
  undefined4 uVar8;
  Type in1;
  Type in0;
  float afStack_140 [6];
  float local_128 [4];
  float local_118 [2];
  ulong local_110;
  undefined4 local_108;
  undefined8 local_100;
  undefined4 local_f8;
  undefined8 local_f0;
  undefined4 local_e8;
  undefined8 local_e0;
  undefined4 local_d8;
  float local_d4;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  Vector<float,_3> res_2;
  Vector<float,_3> res;
  Vector<float,_3> res_1;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  puVar1 = &local_48;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    lVar2 = 0;
    lVar6 = 0;
    do {
      lVar7 = 0;
      do {
        uVar8 = 0x3f800000;
        if (lVar2 != lVar7) {
          uVar8 = 0;
        }
        *(undefined4 *)((long)puVar1 + lVar7) = uVar8;
        lVar7 = lVar7 + 0x10;
      } while (lVar7 != 0x40);
      lVar6 = lVar6 + 1;
      puVar1 = (undefined8 *)((long)puVar1 + 4);
      lVar2 = lVar2 + 0x10;
    } while (lVar6 != 4);
    local_48 = *(undefined8 *)evalCtx->in[0].m_data;
    uStack_40 = *(undefined8 *)(evalCtx->in[0].m_data + 2);
    local_38 = *(undefined8 *)evalCtx->in[1].m_data;
    uStack_30 = *(undefined8 *)(evalCtx->in[1].m_data + 2);
    local_28 = *(undefined8 *)evalCtx->in[2].m_data;
    uStack_20 = *(undefined8 *)(evalCtx->in[2].m_data + 2);
    local_18 = *(undefined8 *)evalCtx->in[3].m_data;
    uStack_10 = *(undefined8 *)(evalCtx->in[3].m_data + 2);
  }
  else {
    local_18 = 0;
    uStack_10 = 0;
    local_28 = 0;
    uStack_20 = 0;
    local_38 = 0;
    uStack_30 = 0;
    local_48 = 0;
    uStack_40 = 0;
    puVar3 = &sr::(anonymous_namespace)::s_constInMat4x4;
    lVar2 = 0;
    do {
      lVar6 = 0;
      do {
        *(undefined4 *)((long)puVar1 + lVar6 * 4) = *(undefined4 *)((long)puVar3 + lVar6);
        lVar6 = lVar6 + 4;
      } while (lVar6 != 0x10);
      lVar2 = lVar2 + 1;
      puVar1 = (undefined8 *)((long)puVar1 + 4);
      puVar3 = puVar3 + 4;
    } while (lVar2 != 4);
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    puVar1 = &uStack_88;
    lVar2 = 0;
    lVar6 = 0;
    do {
      lVar7 = 0;
      do {
        uVar8 = 0x3f800000;
        if (lVar2 != lVar7) {
          uVar8 = 0;
        }
        *(undefined4 *)((long)puVar1 + lVar7) = uVar8;
        lVar7 = lVar7 + 0x10;
      } while (lVar7 != 0x40);
      lVar6 = lVar6 + 1;
      puVar1 = (undefined8 *)((long)puVar1 + 4);
      lVar2 = lVar2 + 0x10;
    } while (lVar6 != 4);
    uStack_88 = *(undefined8 *)evalCtx->in[0].m_data;
    res_2.m_data._0_8_ = *(undefined8 *)(evalCtx->in[0].m_data + 2);
    stack0xffffffffffffff88 = *(undefined8 *)evalCtx->in[1].m_data;
  }
  else {
    puVar1 = &uStack_88;
    stack0xffffffffffffff88 = 0;
    uStack_88 = 0;
    res_2.m_data[0] = 0.0;
    res_2.m_data[1] = 0.0;
    puVar3 = &DAT_00af0c00;
    lVar2 = 0;
    do {
      lVar6 = 0;
      do {
        *(undefined4 *)((long)puVar1 + lVar6 * 4) = *(undefined4 *)((long)puVar3 + lVar6);
        lVar6 = lVar6 + 4;
      } while (lVar6 != 0x10);
      lVar2 = lVar2 + 1;
      puVar1 = (undefined8 *)((long)puVar1 + 4);
      puVar3 = puVar3 + 4;
    } while (lVar2 != 4);
  }
  puVar1 = &local_c8;
  local_98 = 0;
  uStack_90 = 0;
  local_a8 = 0;
  uStack_a0 = 0;
  uStack_b4 = 0;
  uStack_b0 = 0;
  uStack_ac = 0;
  local_c8 = 0;
  uStack_c0 = 0;
  lVar2 = 0;
  lVar6 = 0;
  do {
    lVar7 = 0;
    do {
      uVar8 = 0x3f800000;
      if (lVar2 != lVar7) {
        uVar8 = 0;
      }
      *(undefined4 *)((long)puVar1 + lVar7) = uVar8;
      lVar7 = lVar7 + 0x10;
    } while (lVar7 != 0x40);
    lVar6 = lVar6 + 1;
    puVar1 = (undefined8 *)((long)puVar1 + 4);
    lVar2 = lVar2 + 0x10;
  } while (lVar6 != 4);
  puVar1 = &local_c8;
  puVar4 = &uStack_88;
  puVar5 = &local_48;
  lVar2 = 0;
  do {
    lVar6 = 0;
    do {
      *(float *)((long)puVar1 + lVar6) =
           *(float *)((long)puVar5 + lVar6) * *(float *)((long)puVar4 + lVar6);
      lVar6 = lVar6 + 0x10;
    } while (lVar6 != 0x40);
    lVar2 = lVar2 + 1;
    puVar1 = (undefined8 *)((long)puVar1 + 4);
    puVar4 = (undefined8 *)((long)puVar4 + 4);
    puVar5 = (undefined8 *)((long)puVar5 + 4);
  } while (lVar2 != 4);
  local_e0 = local_c8;
  local_d8 = (undefined4)uStack_c0;
  local_f0 = CONCAT44(uStack_b0,uStack_b4);
  local_e8 = uStack_ac;
  local_128[0] = 0.0;
  local_128[1] = 0.0;
  local_128[2] = 0.0;
  lVar2 = 0;
  do {
    local_128[lVar2] =
         *(float *)((long)&local_e0 + lVar2 * 4) + *(float *)((long)&local_f0 + lVar2 * 4);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_100 = uStack_a0;
  local_f8 = (undefined4)local_a8;
  local_118[0] = 0.0;
  local_118[1] = 0.0;
  local_110 = local_110 & 0xffffffff00000000;
  lVar2 = 0;
  do {
    local_118[lVar2] = local_128[lVar2] + *(float *)((long)&local_100 + lVar2 * 4);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_d4 = uStack_90._4_4_;
  local_d0 = local_98;
  afStack_140[2] = 0.0;
  afStack_140[3] = 0.0;
  afStack_140[4] = 0.0;
  lVar2 = 0;
  do {
    afStack_140[lVar2 + 2] = local_118[lVar2] + (&local_d4)[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_110 = 0x100000000;
  local_108 = 2;
  lVar2 = 2;
  do {
    (evalCtx->color).m_data[(int)local_118[lVar2]] = afStack_140[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(matrixCompMult(in0, in1));
	}